

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O1

bool __thiscall
ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_Mesh *mesh)

{
  ON_2fPointArray *this_00;
  uint *puVar1;
  ON_2dVector ngon_sub_pack_rect_delta_00;
  ON_2dVector ngon_sub_pack_rect_size_00;
  double dVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ON_SimpleArray<ON_3dPoint> *this_01;
  ON_SubDVertex *pOVar7;
  int iVar8;
  ON_3dPoint *pOVar9;
  uint i;
  ulong uVar10;
  ON_2dPoint *pOVar11;
  ulong uVar12;
  ON_SubDFace *pOVar13;
  uint i_1;
  long lVar14;
  ON_MeshNgon *pOVar15;
  ON_SimpleArray<ON_2dPoint> *this_02;
  long lVar16;
  bool bVar17;
  ON_2dVector OVar18;
  ON_2dPoint OVar19;
  ON_2dVector face_pack_rect_size;
  ON_MeshFace mesh_f;
  ON_3dPoint C;
  ON_3fVector N;
  ON_3dPoint faceT [2];
  ON_SimpleArray<ON_3dPoint> P;
  ON_2dVector ngon_sub_pack_rect_delta;
  ON_2dVector ngon_sub_pack_rect_size;
  ON_MappingTag mapping_tag;
  ON_2dPoint quadS [4];
  ON_3dPoint quadP [4];
  ON_2dPoint face_pack_rect_corners [4];
  ON_MeshFace local_2f8;
  ON_3dPoint local_2e8;
  ON_SimpleArray<ON_3fVector> *local_2d0;
  ON_SimpleArray<ON_3fVector> *local_2c8;
  ON_SimpleArray<ON_MeshFace> *local_2c0;
  ON_MeshNgon *local_2b8;
  ON_3fVector local_2ac;
  ON_SimpleArray<ON_2dPoint> *local_2a0;
  ON_3dPoint local_298;
  ON_3dPoint local_280;
  ON_SimpleArray<ON_3dPoint> local_260;
  ulong local_248;
  ON_2udex local_240;
  double local_238;
  double local_230;
  ON_2dVector local_228;
  double local_218;
  double dStack_210;
  ON_SubD *local_200;
  ulong local_1f8;
  ON_3dPoint local_1f0;
  ON_2dVector local_1d8;
  ON_2dVector local_1c8;
  undefined1 local_1b8 [24];
  ON_3dPoint local_1a0;
  double local_188;
  uchar auStack_180 [8];
  double local_178;
  double local_170;
  uchar auStack_168 [8];
  double local_160;
  ON_2dPoint local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  ON_3dPoint local_d8;
  double local_c0;
  uchar auStack_b8 [8];
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  ON_3dPoint local_90;
  ON_2dPoint local_78 [4];
  
  uVar4 = TexturePointsAreSet(this);
  uVar5 = FaceCount(this);
  pOVar13 = level->m_face[0];
  if (pOVar13 == (ON_SubDFace *)0x0) {
    uVar12 = 0;
    iVar8 = 0;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    uVar10 = 0;
    uVar12 = 0;
    do {
      uVar6 = ON_SubDFace::EdgeCount(pOVar13);
      if (2 < uVar6) {
        iVar8 = (int)uVar12;
        if (!bVar3) {
          if (uVar6 == 4) {
            uVar12 = (ulong)(iVar8 + 1);
            goto LAB_00633aed;
          }
          iVar8 = iVar8 * 4;
          bVar3 = true;
          uVar10 = uVar12;
        }
        uVar10 = (ulong)((uint)(uVar6 == 4) + (int)uVar10);
        uVar12 = (ulong)(iVar8 + uVar6);
      }
LAB_00633aed:
      iVar8 = (int)uVar10;
      pOVar13 = pOVar13->m_next_face;
    } while (pOVar13 != (ON_SubDFace *)0x0);
  }
  if ((int)uVar12 == 0) {
    ON_SubDIncrementErrorCount();
    goto LAB_006349bd;
  }
  local_2c0 = &mesh->m_F;
  local_200 = this;
  if ((ulong)(long)(mesh->m_F).m_capacity < uVar12) {
    ON_SimpleArray<ON_MeshFace>::SetCapacity(local_2c0,uVar12);
  }
  if (-1 < (mesh->m_F).m_capacity) {
    (mesh->m_F).m_count = 0;
  }
  local_2c8 = &(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>;
  if ((ulong)(long)(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar12) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(local_2c8,uVar12);
  }
  if (-1 < (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  uVar10 = (ulong)(uint)((int)uVar12 * 4 + iVar8 * -7);
  this_01 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
  if ((ulong)(long)this_01->m_capacity < uVar10) {
    ON_SimpleArray<ON_3dPoint>::SetCapacity(this_01,uVar10);
  }
  if (-1 < this_01->m_capacity) {
    this_01->m_count = 0;
  }
  local_2d0 = &(mesh->m_N).super_ON_SimpleArray<ON_3fVector>;
  if ((ulong)(long)(mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar10) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(local_2d0,uVar10);
  }
  if (-1 < (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  this_02 = &(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
  local_248 = uVar12;
  if ((ulong)(long)(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar10) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity(this_02,uVar10);
  }
  uVar4 = uVar4 * 2;
  if (-1 < (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
    (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  }
  if ((uVar5 < uVar4) &&
     ((ulong)(long)(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar10)) {
    ON_SimpleArray<ON_2fPoint>::SetCapacity(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar10);
  }
  if (-1 < (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity) {
    (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
  }
  if ((ulong)(long)(mesh->m_F).m_capacity < uVar12) {
    ON_SimpleArray<ON_MeshFace>::SetCapacity(local_2c0,uVar12);
  }
  if (-1 < (mesh->m_F).m_capacity) {
    (mesh->m_F).m_count = 0;
  }
  if ((ulong)(long)(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar12) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(local_2c8,uVar12);
  }
  if (-1 < (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  dVar2 = ON_DBL_QNAN;
  this_00 = &mesh->m_T;
  if (bVar3) {
    local_218 = ON_2dVector::NanVector.x;
    dStack_210 = ON_2dVector::NanVector.y;
    local_228.x = ON_2dVector::NanVector.x;
    local_228.y = ON_2dVector::NanVector.y;
    local_118.x = ON_2dPoint::NanPoint.x;
    local_118.y = ON_2dPoint::NanPoint.y;
    local_108 = ON_2dPoint::NanPoint.x;
    dStack_100 = ON_2dPoint::NanPoint.y;
    local_f8 = ON_2dPoint::NanPoint.x;
    dStack_f0 = ON_2dPoint::NanPoint.y;
    local_e8 = ON_2dPoint::NanPoint.x;
    dStack_e0 = ON_2dPoint::NanPoint.y;
    local_1b8._16_8_ = ON_3dPoint::NanPoint.z;
    local_1b8._0_8_ = ON_3dPoint::NanPoint.x;
    local_1b8._8_8_ = ON_3dPoint::NanPoint.y;
    local_1a0.x = ON_3dPoint::NanPoint.x;
    local_1a0.y = ON_3dPoint::NanPoint.y;
    local_1a0.z = ON_3dPoint::NanPoint.z;
    local_188 = ON_3dPoint::NanPoint.x;
    auStack_180 = (uchar  [8])ON_3dPoint::NanPoint.y;
    local_178 = ON_3dPoint::NanPoint.z;
    local_170 = ON_3dPoint::NanPoint.x;
    auStack_168 = (uchar  [8])ON_3dPoint::NanPoint.y;
    local_160 = ON_3dPoint::NanPoint.z;
    local_298.z = ON_3dPoint::NanPoint.z;
    local_298.x = ON_3dPoint::NanPoint.x;
    local_298.y = ON_3dPoint::NanPoint.y;
    local_280.x = ON_3dPoint::NanPoint.x;
    local_280.y = ON_3dPoint::NanPoint.y;
    local_280.z = ON_3dPoint::NanPoint.z;
    local_260._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
    local_260.m_a = (ON_3dPoint *)0x0;
    local_260.m_count = 0;
    local_260.m_capacity = 0;
    ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_260,0x40);
    pOVar13 = level->m_face[0];
    if (pOVar13 != (ON_SubDFace *)0x0) {
      local_2a0 = this_02;
      do {
        if (2 < pOVar13->m_edge_count) {
          if (-1 < (long)local_260._16_8_) {
            local_260._16_8_ = local_260._16_8_ & 0xffffffff00000000;
          }
          uVar6 = 1;
          local_2b8 = (ON_MeshNgon *)(ulong)pOVar13->m_edge_count;
          do {
            pOVar7 = ON_SubDFace::Vertex(pOVar13,uVar6 - 1);
            if (pOVar7 == (ON_SubDVertex *)0x0) break;
            ON_SubDVertex::ControlNetPoint(&local_2e8,pOVar7);
            bVar3 = ON_3dPoint::IsValid(&local_2e8);
            if (!bVar3) break;
            ON_SubDVertex::ControlNetPoint(&local_1f0,pOVar7);
            ON_SimpleArray<ON_3dPoint>::Append(&local_260,&local_1f0);
            bVar17 = uVar6 < (uint)local_2b8;
            uVar6 = uVar6 + 1;
          } while (bVar3 && bVar17);
          pOVar15 = local_2b8;
          iVar8 = (int)local_2b8;
          if (local_260.m_count == iVar8) {
            ON_SubDFace::ControlNetCenterPoint(&local_2e8,pOVar13);
            local_d8.z = local_2e8.z;
            local_d8.x = local_2e8.x;
            local_d8.y = local_2e8.y;
            bVar3 = ON_3dPoint::IsValid(&local_d8);
            if (bVar3) {
              ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&local_2e8,pOVar13);
              ON_3fVector::ON_3fVector(&local_2ac,(ON_3dVector *)&local_2e8);
              ON_SubDFace::GetFacePackRectCorners(pOVar13,false,local_78);
              OVar18 = ON_SubDFace::PackRectSize(pOVar13);
              local_238 = OVar18.y;
              local_230 = OVar18.x;
              if (uVar5 < uVar4) {
                ON_SubDFace::TexturePoint(&local_2e8,pOVar13,iVar8 - 1);
                local_298.z = local_2e8.z;
                local_298.x = local_2e8.x;
                local_298.y = local_2e8.y;
                ON_SubDFace::TexturePoint(&local_2e8,pOVar13,0);
                local_280.z = local_2e8.z;
                local_280.x = local_2e8.x;
                local_280.y = local_2e8.y;
                ON_SubDFace::TextureCenterPoint(&local_2e8,pOVar13);
                local_1b8._16_8_ = local_2e8.z;
                local_1b8._0_8_ = local_2e8.x;
                local_1b8._8_8_ = local_2e8.y;
              }
              if (iVar8 == 4) {
                local_2f8.vi[0] = this_01->m_count;
                ON_SimpleArray<ON_3dPoint>::Append(this_01,&local_d8);
                ON_SimpleArray<ON_3fVector>::Append(local_2d0,&local_2ac);
                OVar19 = ON_SubDFace::PackRectOrigin(pOVar13);
                local_1f0.y = OVar19.y;
                local_1f0.x = OVar19.x;
                OVar18 = ON_SubDFace::PackRectSize(pOVar13);
                local_1d8.y = OVar18.y;
                local_1d8.x = OVar18.x;
                OVar18 = ::operator*(0.5,&local_1d8);
                local_1c8.y = OVar18.y;
                local_1c8.x = OVar18.x;
                OVar19 = ON_2dPoint::operator+((ON_2dPoint *)&local_1f0,&local_1c8);
                local_2e8.y = OVar19.y;
                local_2e8.x = OVar19.x;
                ON_SimpleArray<ON_2dPoint>::Append(this_02,(ON_2dPoint *)&local_2e8);
                if (uVar5 < uVar4) {
                  ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_2e8,(ON_3dPoint *)local_1b8);
                  ON_SimpleArray<ON_2fPoint>::Append
                            (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_2e8);
                }
                local_2b8 = ON_Mesh::AllocateNgon(mesh,8,4);
                uVar6 = this_01->m_count;
                puVar1 = local_2b8->m_vi;
                *puVar1 = uVar6;
                puVar1[1] = uVar6 + 1;
                puVar1[2] = uVar6 + 2;
                puVar1[3] = uVar6 + 3;
                puVar1[4] = uVar6 + 4;
                puVar1[5] = uVar6 + 5;
                puVar1[6] = uVar6 + 6;
                puVar1[7] = uVar6 + 7;
                uVar6 = (mesh->m_F).m_count;
                puVar1 = local_2b8->m_fi;
                *puVar1 = uVar6;
                puVar1[1] = uVar6 + 1;
                puVar1[2] = uVar6 + 2;
                puVar1[3] = uVar6 + 3;
                lVar16 = 1;
                pOVar11 = local_78;
                lVar14 = 0;
                do {
                  ON_SimpleArray<ON_3dPoint>::Append
                            (this_01,(ON_3dPoint *)((long)&(local_260.m_a)->x + lVar14));
                  uVar6 = (uint)lVar16 & 3;
                  ON_3dPoint::Midpoint
                            (&local_2e8,(ON_3dPoint *)((long)&(local_260.m_a)->x + lVar14),
                             local_260.m_a + uVar6);
                  ON_SimpleArray<ON_3dPoint>::Append(this_01,&local_2e8);
                  ON_SimpleArray<ON_3fVector>::Append(local_2d0,&local_2ac);
                  ON_SimpleArray<ON_3fVector>::Append(local_2d0,&local_2ac);
                  ON_SimpleArray<ON_2dPoint>::Append(this_02,pOVar11);
                  OVar19 = ON_2dPoint::Midpoint
                                     (pOVar11,(ON_2dPoint *)
                                              ((long)&local_78[0].x + (ulong)(uVar6 << 4)));
                  local_2e8.y = OVar19.y;
                  local_2e8.x = OVar19.x;
                  ON_SimpleArray<ON_2dPoint>::Append(this_02,(ON_2dPoint *)&local_2e8);
                  if (uVar5 < uVar4) {
                    local_298.z = local_280.z;
                    local_298.x = local_280.x;
                    local_298.y = local_280.y;
                    ON_SubDFace::TexturePoint(&local_2e8,pOVar13,uVar6);
                    local_280.z = local_2e8.z;
                    local_280.x = local_2e8.x;
                    local_280.y = local_2e8.y;
                    ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_2e8,&local_298);
                    ON_SimpleArray<ON_2fPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_2e8);
                    ON_3dPoint::Midpoint(&local_2e8,&local_298,&local_280);
                    this_02 = local_2a0;
                    ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_1f0,&local_2e8);
                    ON_SimpleArray<ON_2fPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_1f0);
                  }
                  pOVar15 = local_2b8;
                  lVar14 = lVar14 + 0x18;
                  pOVar11 = pOVar11 + 1;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 5);
                local_2f8.vi[3] = local_2b8->m_vi[7];
                lVar14 = 0;
                do {
                  local_2f8.vi[1] = local_2f8.vi[3];
                  local_2f8.vi[2] = pOVar15->m_vi[lVar14 * 2];
                  local_2f8.vi[3] = local_2f8.vi[2] + 1;
                  ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2f8);
                  ON_SimpleArray<ON_3fVector>::Append(local_2c8,&local_2ac);
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 4);
                ON_Mesh::AddNgon(mesh,pOVar15);
              }
              else {
                ON_3dPoint::Midpoint(&local_2e8,local_260.m_a + (iVar8 - 1),local_260.m_a);
                pOVar9 = &local_90;
                local_90.z = local_2e8.z;
                local_90.x = local_2e8.x;
                local_90.y = local_2e8.y;
                if (uVar5 < uVar4) {
                  ON_3dPoint::Midpoint(&local_2e8,&local_298,&local_280);
                  pOVar9 = &local_1a0;
                  local_160 = local_2e8.z;
                  local_170 = local_2e8.x;
                  auStack_168 = (uchar  [8])local_2e8.y;
                }
                if ((ushort)pOVar15 < 5) {
                  local_240 = ON_2udex::Zero;
                }
                else {
                  OVar18.y = local_238;
                  OVar18.x = local_230;
                  local_240 = ON_SubDFace::GetNgonSubPackRectSizeAndDelta
                                        ((ON_SubDFace *)((ulong)pOVar15 & 0xffffffff),
                                         (uint)&local_218,OVar18,&local_228,(ON_2dVector *)pOVar9);
                }
                local_1f8 = (ulong)pOVar15 & 0xffffffff;
                uVar12 = 0;
                while (uVar12 != local_1f8) {
                  if ((uint)pOVar15 == 3) {
                    ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners
                              (false,local_78,(uint)uVar12,false,&local_118);
                  }
                  else {
                    ngon_sub_pack_rect_size_00.y = dStack_210;
                    ngon_sub_pack_rect_size_00.x = local_218;
                    ngon_sub_pack_rect_delta_00.y = local_228.y;
                    ngon_sub_pack_rect_delta_00.x = local_228.x;
                    face_pack_rect_size.y = local_238;
                    face_pack_rect_size.x = local_230;
                    ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners
                              ((uint)pOVar15,(uint)uVar12,false,local_78,face_pack_rect_size,
                               local_240,ngon_sub_pack_rect_size_00,ngon_sub_pack_rect_delta_00,
                               &local_118);
                  }
                  local_b0 = local_90.z;
                  local_c0 = local_90.x;
                  auStack_b8 = (uchar  [8])local_90.y;
                  pOVar9 = local_260.m_a + uVar12;
                  local_98 = pOVar9->z;
                  local_a8 = pOVar9->x;
                  dStack_a0 = pOVar9->y;
                  uVar12 = uVar12 + 1;
                  uVar10 = (uVar12 & 0xffffffff) % ((ulong)pOVar15 & 0xffffffff);
                  ON_3dPoint::Midpoint(&local_2e8,pOVar9,local_260.m_a + uVar10);
                  local_90.z = local_2e8.z;
                  local_90.x = local_2e8.x;
                  local_90.y = local_2e8.y;
                  if (uVar5 < uVar4) {
                    local_298.z = local_280.z;
                    local_298.x = local_280.x;
                    local_298.y = local_280.y;
                    ON_SubDFace::TexturePoint(&local_2e8,pOVar13,(uint)uVar10);
                    local_280.z = local_2e8.z;
                    local_280.x = local_2e8.x;
                    local_280.y = local_2e8.y;
                    local_1a0.z = local_160;
                    local_1a0.x = local_170;
                    local_1a0.y = (double)auStack_168;
                    local_178 = local_298.z;
                    local_188 = local_298.x;
                    auStack_180 = (uchar  [8])local_298.y;
                    ON_3dPoint::Midpoint(&local_2e8,&local_298,&local_280);
                    local_160 = local_2e8.z;
                    local_170 = local_2e8.x;
                    auStack_168 = (uchar  [8])local_2e8.y;
                  }
                  local_2f8.vi[0] = this_01->m_count;
                  local_2f8.vi[1] = local_2f8.vi[0] + 1;
                  local_2f8.vi[2] = local_2f8.vi[0] + 2;
                  local_2f8.vi[3] = local_2f8.vi[0] + 3;
                  pOVar11 = &local_118;
                  lVar14 = 0;
                  do {
                    ON_SimpleArray<ON_3dPoint>::Append
                              (this_01,(ON_3dPoint *)((long)&local_d8.x + lVar14));
                    ON_SimpleArray<ON_3fVector>::Append(local_2d0,&local_2ac);
                    ON_SimpleArray<ON_2dPoint>::Append(this_02,pOVar11);
                    if (uVar5 < uVar4) {
                      ON_2fPoint::ON_2fPoint
                                ((ON_2fPoint *)&local_2e8,(ON_3dPoint *)(local_1b8 + lVar14));
                      ON_SimpleArray<ON_2fPoint>::Append
                                (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_2e8
                                );
                    }
                    lVar14 = lVar14 + 0x18;
                    pOVar11 = pOVar11 + 1;
                  } while (lVar14 != 0x60);
                  ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2f8);
                  pOVar15 = local_2b8;
                  ON_SimpleArray<ON_3fVector>::Append(local_2c8,&local_2ac);
                }
              }
            }
          }
        }
        pOVar13 = pOVar13->m_next_face;
      } while (pOVar13 != (ON_SubDFace *)0x0);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_260);
  }
  else {
    pOVar13 = level->m_face[0];
    if (pOVar13 != (ON_SubDFace *)0x0) {
      local_2a0 = this_02;
      do {
        if (pOVar13->m_edge_count == 4) {
          local_90.x = dVar2;
          pOVar9 = &local_d8;
          uVar12 = 0;
          do {
            pOVar7 = ON_SubDFace::Vertex(pOVar13,(uint)uVar12);
            if (pOVar7 == (ON_SubDVertex *)0x0) break;
            ON_SubDVertex::ControlNetPoint((ON_3dPoint *)local_1b8,pOVar7);
            pOVar9->z = (double)local_1b8._16_8_;
            pOVar9->x = (double)local_1b8._0_8_;
            pOVar9->y = (double)local_1b8._8_8_;
            bVar3 = ON_3dPoint::IsValid(pOVar9);
            if (!bVar3) break;
            pOVar9 = pOVar9 + 1;
            bVar3 = uVar12 < 3;
            uVar12 = uVar12 + 1;
          } while (bVar3);
          bVar3 = ON_3dPoint::IsValid(&local_90);
          if (bVar3) {
            ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)local_1b8,pOVar13);
            ON_3fVector::ON_3fVector((ON_3fVector *)&local_118,(ON_3dVector *)local_1b8);
            local_2f8.vi[0] = this_01->m_count;
            local_2f8.vi[1] = local_2f8.vi[0] + 1;
            local_2f8.vi[2] = local_2f8.vi[0] + 2;
            local_2f8.vi[3] = local_2f8.vi[0] + 3;
            ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2f8);
            ON_SimpleArray<ON_3fVector>::Append(local_2c8,(ON_3fVector *)&local_118);
            pOVar9 = &local_d8;
            lVar14 = 0;
            do {
              ON_SimpleArray<ON_3dPoint>::Append(this_01,pOVar9);
              ON_SimpleArray<ON_3fVector>::Append(local_2d0,(ON_3fVector *)&local_118);
              OVar19 = ON_SubDFace::PackRectCorner(pOVar13,false,(uint)lVar14);
              local_1b8._8_8_ = OVar19.y;
              local_1b8._0_8_ = OVar19.x;
              ON_SimpleArray<ON_2dPoint>::Append(this_02,(ON_2dPoint *)local_1b8);
              if (uVar5 < uVar4) {
                ON_SubDFace::TexturePoint((ON_3dPoint *)local_1b8,pOVar13,(uint)lVar14);
                ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_298,(ON_3dPoint *)local_1b8);
                this_02 = local_2a0;
                ON_SimpleArray<ON_2fPoint>::Append
                          (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_298);
              }
              lVar14 = lVar14 + 1;
              pOVar9 = pOVar9 + 1;
            } while (lVar14 != 4);
          }
        }
        pOVar13 = pOVar13->m_next_face;
      } while (pOVar13 != (ON_SubDFace *)0x0);
    }
  }
  TextureMappingTag((ON_MappingTag *)local_1b8,local_200,false);
  uVar12 = local_248;
  dVar2 = ON_Interval::ZeroToOne.m_t[1];
  if ((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == this_01->m_count) {
    *(double *)&mesh->field_0x240 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x248 = dVar2;
    dVar2 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x250 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x258 = dVar2;
    mesh->m_srf_scale[0] = 0.0;
    mesh->m_srf_scale[1] = 0.0;
    dVar2 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x270 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x278 = dVar2;
    dVar2 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x280 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x288 = dVar2;
    mesh->m_packed_tex_rotate = false;
    if (uVar4 <= uVar5) {
      bVar3 = ON_MappingTag::IsSet((ON_MappingTag *)local_1b8);
      if ((!bVar3) ||
         (bVar3 = ON_MappingTag::IsDefaultSurfaceParameterMapping((ON_MappingTag *)local_1b8), bVar3
         )) {
        uVar6 = (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
        if ((uint)(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar6) {
          ON_SimpleArray<ON_2fPoint>::SetCapacity
                    (&this_00->super_ON_SimpleArray<ON_2fPoint>,(long)(int)uVar6);
        }
        if (-1 < (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity) {
          (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
        }
        if (0 < (int)uVar6) {
          lVar14 = 0;
          do {
            ON_2fPoint::ON_2fPoint
                      ((ON_2fPoint *)&local_118,
                       (ON_2dPoint *)
                       ((long)&((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar14));
            ON_SimpleArray<ON_2fPoint>::Append
                      (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_118);
            lVar14 = lVar14 + 0x10;
          } while ((long)(int)uVar6 * 0x10 != lVar14);
        }
      }
      goto LAB_00634977;
    }
LAB_00634989:
    if ((mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != this_01->m_count) {
      ON_SimpleArray<ON_2fPoint>::SetCapacity(&this_00->super_ON_SimpleArray<ON_2fPoint>,0);
    }
  }
  else {
    ON_SimpleArray<ON_2dPoint>::SetCapacity(this_02,0);
    uVar12 = local_248;
    if (local_1b8._16_4_ == srfp_mapping) {
      memcpy(local_1b8,&ON_MappingTag::Unset,0x98);
    }
LAB_00634977:
    if (uVar5 < uVar4) goto LAB_00634989;
  }
  memcpy(&mesh->m_Ttag,local_1b8,0x98);
LAB_006349bd:
  return (int)uVar12 != 0;
}

Assistant:

bool ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_Mesh& mesh
) const
{
  const bool bSetMeshT = 2 * this->TexturePointsAreSet() > this->FaceCount(); // more than half the faces have texture points.

  bool bSubdivide = false; // required if any SubD faces are not quads.
  unsigned mesh_4gon_count = 0;
  unsigned mesh_quad_count = 0;
  for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
  {
    const unsigned n = f->EdgeCount();
    if (n < 3)
      continue;

    if (false == bSubdivide)
    {
      if (4 == n)
      {
        // subdivision is not required and we have another quad face
        ++mesh_quad_count;
        continue;
      }
      // first non-quad SubD face - switch to subdivided case
      bSubdivide = true;

      // each of the previously counted quad faces will generate 9 mesh vertices, 4 mesh faces, and a single ON_MeshNgon.
      mesh_4gon_count = mesh_quad_count;
      mesh_quad_count *= 4;
    }

    // In the subdivided case, each SubD face is represented by n quads in the ON_Mesh.
    if ( 4 == n)
      ++mesh_4gon_count;
    mesh_quad_count += n;
  }

  if (mesh_quad_count < 1)
    return ON_SUBD_RETURN_ERROR(false);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  const unsigned mesh_vertex_count = 4 * (mesh_quad_count - 4* mesh_4gon_count) + 9 * mesh_4gon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(mesh_vertex_count);
  D.SetCount(0);
  mesh.m_N.Reserve(mesh_vertex_count);
  mesh.m_N.SetCount(0);
  mesh.m_S.Reserve(mesh_vertex_count);
  mesh.m_S.SetCount(0);
  if (bSetMeshT)
    mesh.m_T.Reserve(mesh_vertex_count);
  mesh.m_T.SetCount(0);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  ON_MeshFace mesh_f;
  ON_2dPoint face_pack_rect_corners[4];
  ON_3dPoint quadP[4];
  if (bSubdivide)
  {
    ON_2dVector ngon_sub_pack_rect_size = ON_2dVector::NanVector;
    ON_2dVector ngon_sub_pack_rect_delta = ON_2dVector::NanVector;
    ON_2dPoint quadS[4] = { ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint };
    ON_3dPoint quadT[4] = { ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint };
    ON_3dPoint faceT[2] = { ON_3dPoint ::NanPoint, ON_3dPoint::NanPoint };


    ON_SimpleArray<ON_3dPoint> P(64);
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      const unsigned n = f->m_edge_count;
      if (n < 3)
        continue;

      P.SetCount(0);
      for (unsigned i = 0; i < n; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        const ON_3dPoint C = v->ControlNetPoint();
        if (false == C.IsValid())
          break;
        P.Append(v->ControlNetPoint());
      }
      if (n != P.UnsignedCount())
        continue;

      quadP[0] = f->ControlNetCenterPoint();
      if (false == quadP[0].IsValid())
        continue;

      const ON_3fVector N(f->ControlNetCenterNormal());

      f->GetFacePackRectCorners(false, face_pack_rect_corners);
      const ON_2dVector face_pack_rect_size = f->PackRectSize();

      if (bSetMeshT)
      {
        faceT[0] = f->TexturePoint(n - 1);
        faceT[1] = f->TexturePoint(0);
        quadT[0] = f->TextureCenterPoint();
      }


      if (4 == n)
      {
        // An ON_SubDFace quad becomes an ON_Mesh ngon made from 4 ON_Mesh quads.

        // center point
        mesh_f.vi[0] = D.UnsignedCount();
        D.Append(quadP[0]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectOrigin() + 0.5 * f->PackRectSize());
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(quadT[0]));

        ON_MeshNgon* four_gon = mesh.AllocateNgon(8,4);
        four_gon->m_vi[0] = D.UnsignedCount();
        four_gon->m_vi[1] = four_gon->m_vi[0] + 1;
        four_gon->m_vi[2] = four_gon->m_vi[0] + 2;
        four_gon->m_vi[3] = four_gon->m_vi[0] + 3;
        four_gon->m_vi[4] = four_gon->m_vi[0] + 4;
        four_gon->m_vi[5] = four_gon->m_vi[0] + 5;
        four_gon->m_vi[6] = four_gon->m_vi[0] + 6;
        four_gon->m_vi[7] = four_gon->m_vi[0] + 7;

        four_gon->m_fi[0] = mesh.m_F.UnsignedCount();
        four_gon->m_fi[1] = four_gon->m_fi[0] + 1;
        four_gon->m_fi[2] = four_gon->m_fi[0] + 2;
        four_gon->m_fi[3] = four_gon->m_fi[0] + 3;

        // add 8 boundary vertices
        for (unsigned i = 0; i < 4; ++i)
        {
          D.Append(P[i]);
          D.Append(ON_3dPoint::Midpoint(P[i], P[(i + 1) % 4]));
          mesh.m_N.Append(N);
          mesh.m_N.Append(N);
          mesh.m_S.Append(face_pack_rect_corners[i]);
          mesh.m_S.Append(ON_2dPoint::Midpoint(face_pack_rect_corners[i], face_pack_rect_corners[(i+1)%4]));
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % 4);
            mesh.m_T.Append(ON_2fPoint(faceT[0]));
            mesh.m_T.Append(ON_2fPoint(ON_3dPoint::Midpoint(faceT[0], faceT[1])));
          }
        }

        // add 4 ON_Mesh quads that make up the ON_SubDFace quad
        mesh_f.vi[3] = four_gon->m_vi[7];
        for (unsigned i = 0; i < 4; ++i)
        {
          mesh_f.vi[1] = mesh_f.vi[3];
          mesh_f.vi[2] = four_gon->m_vi[2 * i];
          mesh_f.vi[3] = mesh_f.vi[2] + 1;
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }

        // add an ON_MeshNgon that represents the ON_SubDFace quad
        mesh.AddNgon(four_gon);
      }
      else
      {
        quadP[3] = ON_3dPoint::Midpoint(P[n - 1], P[0]);
        if (bSetMeshT)
          quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);


        const ON_2udex ngon_grid_size
          = (n >= 5)
          ? ON_SubDFace::GetNgonSubPackRectSizeAndDelta(n, face_pack_rect_size, ngon_sub_pack_rect_size, ngon_sub_pack_rect_delta)
          : ON_2udex::Zero;

        // an ON_Mesh n-gon is not possible because the fake packed surface parameters are not continuous across the ON_SubD face.
        for (unsigned i = 0; i < n; ++i)
        {
          if (3 == n)
          {
            ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners(false, face_pack_rect_corners, i, false, quadS);
          }
          else
          {
            ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners(
              n,
              i,
              false,
              face_pack_rect_corners,
              face_pack_rect_size,
              ngon_grid_size,
              ngon_sub_pack_rect_size,
              ngon_sub_pack_rect_delta,
              quadS
            );
          }

          quadP[1] = quadP[3];
          quadP[2] = P[i];
          quadP[3] = ON_3dPoint::Midpoint(P[i], P[(i + 1) % n]);
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % n);
            quadT[1] = quadT[3];
            quadT[2] = faceT[0];
            quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);
          }

          mesh_f.vi[0] = D.UnsignedCount();
          mesh_f.vi[1] = mesh_f.vi[0] + 1;
          mesh_f.vi[2] = mesh_f.vi[1] + 1;
          mesh_f.vi[3] = mesh_f.vi[2] + 1;

          for (unsigned j = 0; j < 4U; ++j)
          {
            D.Append(quadP[j]);
            mesh.m_N.Append(N);
            mesh.m_S.Append(quadS[j]);
            if (bSetMeshT)
              mesh.m_T.Append(ON_2fPoint(quadT[j]));
          }
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }
      }
    }
  }
  else
  {
    // All SubD faces are quads
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      if (4 != f->m_edge_count)
        continue;
      quadP[3].x = ON_DBL_QNAN;
      for (unsigned i = 0; i < 4; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        quadP[i] = v->ControlNetPoint();
        if (false == quadP[i].IsValid())
          break;
      }
      if (false == quadP[3].IsValid())
        continue;
      const ON_3fVector N(f->ControlNetCenterNormal());
      mesh_f.vi[0] = D.UnsignedCount();
      mesh_f.vi[1] = mesh_f.vi[0] + 1;
      mesh_f.vi[2] = mesh_f.vi[1] + 1;
      mesh_f.vi[3] = mesh_f.vi[2] + 1;
      mesh.m_F.Append(mesh_f);
      mesh.m_FN.Append(N);
      for (unsigned i = 0; i < 4U; ++i)
      {
        D.Append(quadP[i]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectCorner(false, i));
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(f->TexturePoint(i)));
      }
    }
  }


  ON_MappingTag mapping_tag = this->TextureMappingTag(false);

  if (mesh.m_S.UnsignedCount() != D.UnsignedCount())
  {
    mesh.m_S.Destroy();
    if (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type)
      mapping_tag = ON_MappingTag::Unset;
  }
  else
  {
    // set fake surface mapping information
    mesh.m_srf_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_srf_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_srf_scale[0] = 0.0;
    mesh.m_srf_scale[1] = 0.0;
    mesh.m_packed_tex_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_rotate = false;

    if (
      false == bSetMeshT
      && (false == mapping_tag.IsSet() || mapping_tag.IsDefaultSurfaceParameterMapping())
      )
    {
      const int count = mesh.m_S.Count();
      mesh.m_T.Reserve(count);
      mesh.m_T.SetCount(0);
      for (int i = 0; i < count; ++i)
        mesh.m_T.Append(ON_2fPoint(mesh.m_S[i]));
    }
  }

  if (bSetMeshT)
  {
    if (mesh.m_T.UnsignedCount() != D.UnsignedCount())
      mesh.m_T.Destroy();
  }
  mesh.m_Ttag = mapping_tag;

  return true;
}